

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PFloat::WriteValue(PFloat *this,FArchive *ar,void *addr)

{
  float singleprecision;
  double doubleprecision;
  float local_14;
  double local_10;
  
  if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 8) {
    local_10 = *addr;
    local_14 = (float)local_10;
    if ((local_10 != (double)local_14) || (NAN(local_10) || NAN((double)local_14))) {
      FArchive::WriteByte(ar,'\v');
      FArchive::operator<<(ar,&local_10);
      return;
    }
  }
  else {
    local_14 = *addr;
  }
  FArchive::WriteByte(ar,'\n');
  FArchive::operator<<(ar,&local_14);
  return;
}

Assistant:

void PFloat::WriteValue(FArchive &ar, const void *addr) const
{
	float singleprecision;
	if (Size == 8)
	{
		// If it can be written as single precision without information
		// loss, then prefer that over writing a full-sized double.
		double doubleprecision = *(double *)addr;
		singleprecision = (float)doubleprecision;
		if (singleprecision != doubleprecision)
		{
			ar.WriteByte(VAL_Float64);
			ar << doubleprecision;
			return;
		}
	}
	else
	{
		singleprecision = *(float *)addr;
	}
	ar.WriteByte(VAL_Float32);
	ar << singleprecision;
}